

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

path * lookup_file_insensitive
                 (path *__return_storage_ptr__,path *path,string *filename,string *error_msg)

{
  pointer pcVar1;
  pointer pcVar2;
  size_type sVar3;
  int iVar4;
  bool bVar5;
  long *plVar6;
  undefined8 *puVar7;
  path *__p;
  long lVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  ulong *puVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  ulong uVar12;
  path *__p_00;
  undefined8 uVar13;
  _Alloc_hider _Var14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  error_code ec;
  directory_iterator di;
  string local_158;
  directory_iterator local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  directory_iterator local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  path local_f8;
  path *local_d0;
  string *local_c8;
  ulong *local_c0;
  long local_b8;
  ulong local_b0 [2];
  error_code local_a0;
  long *local_90 [2];
  long local_80 [2];
  string *local_70;
  path *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  directory_iterator local_40;
  
  local_a0._M_value = 0;
  local_d0 = __return_storage_ptr__;
  local_a0._M_cat = (error_category *)std::_V2::system_category();
  std::filesystem::__cxx11::directory_iterator::directory_iterator(&local_40,path,none,&local_a0);
  if (local_a0._M_value == 0) {
    std::filesystem::__cxx11::directory_iterator::directory_iterator
              (&local_118,path,none,(error_code *)0x0);
    if (local_118._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_118._M_dir._M_refcount._M_pi)->_M_use_count =
             (local_118._M_dir._M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_118._M_dir._M_refcount._M_pi)->_M_use_count =
             (local_118._M_dir._M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_138._M_dir._M_ptr = local_118._M_dir._M_ptr;
    local_138._M_dir._M_refcount._M_pi = local_118._M_dir._M_refcount._M_pi;
    if (local_118._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_118._M_dir._M_refcount._M_pi)->_M_use_count =
             (local_118._M_dir._M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_118._M_dir._M_refcount._M_pi)->_M_use_count =
             (local_118._M_dir._M_refcount._M_pi)->_M_use_count + 1;
      }
      if (local_118._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
      {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_118._M_dir._M_refcount._M_pi);
      }
    }
    local_c8 = filename;
    local_70 = error_msg;
    local_68 = path;
    while (local_138._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
          ) {
      __p = (path *)std::filesystem::__cxx11::directory_iterator::operator*(&local_138);
      sVar3 = (__p->_M_pathname)._M_string_length;
      if (sVar3 == 0) {
LAB_0010f7d9:
        std::filesystem::__cxx11::path::path(&local_f8);
      }
      else {
        uVar12 = *(ulong *)&__p->_M_cmpts;
        __p_00 = __p;
        if ((~(byte)uVar12 & 3) != 0) {
          if (((uVar12 & 3) == 0) && ((__p->_M_pathname)._M_dataplus._M_p[sVar3 - 1] != '/')) {
            if ((uVar12 & 3) == 0) {
              lVar8 = std::filesystem::__cxx11::path::_List::end();
            }
            else {
              lVar8 = 0;
            }
            if (((byte)__p->_M_cmpts & 3) == 0) {
              __p_00 = (path *)(lVar8 + -0x30);
            }
            if ((~*(uint *)&__p_00->_M_cmpts & 3) == 0) goto LAB_0010f7cf;
          }
          goto LAB_0010f7d9;
        }
LAB_0010f7cf:
        std::filesystem::__cxx11::path::path(&local_f8,__p_00);
      }
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_158,local_f8._M_pathname._M_dataplus._M_p,
                 local_f8._M_pathname._M_dataplus._M_p + local_f8._M_pathname._M_string_length);
      bVar5 = compare_string_insensitive(&local_158,local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      std::filesystem::__cxx11::path::~path(&local_f8);
      if ((bVar5) && (std::filesystem::__cxx11::path::path(local_d0,__p), bVar5)) {
        if (local_138._M_dir._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_138._M_dir._M_refcount._M_pi);
        }
        if (local_118._M_dir._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_118._M_dir._M_refcount._M_pi);
        }
        goto LAB_0010fa71;
      }
      std::filesystem::__cxx11::directory_iterator::operator++(&local_138);
    }
    if (local_118._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_118._M_dir._M_refcount._M_pi);
    }
    pcVar1 = (local_c8->_M_dataplus)._M_p;
    local_118._M_dir._M_ptr = (element_type *)&local_108;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_118,pcVar1,pcVar1 + local_c8->_M_string_length);
    std::__cxx11::string::append((char *)&local_118);
    pcVar1 = (local_68->_M_pathname)._M_dataplus._M_p;
    local_138._M_dir._M_ptr = (element_type *)&local_128;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_138,pcVar1,pcVar1 + (local_68->_M_pathname)._M_string_length);
    uVar12 = (long)&(local_118._M_dir._M_refcount._M_pi)->_vptr__Sp_counted_base +
             (long)&(local_138._M_dir._M_refcount._M_pi)->_vptr__Sp_counted_base;
    uVar13 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dir._M_ptr != &local_108) {
      uVar13 = local_108._M_allocated_capacity;
    }
    if ((ulong)uVar13 < uVar12) {
      uVar13 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dir._M_ptr != &local_128) {
        uVar13 = local_128._M_allocated_capacity;
      }
      if ((ulong)uVar13 < uVar12) goto LAB_0010f918;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_138,0,(char *)0x0,(ulong)local_118._M_dir._M_ptr);
    }
    else {
LAB_0010f918:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_138._M_dir._M_ptr);
    }
    puVar10 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar10) {
      local_158.field_2._M_allocated_capacity = *puVar10;
      local_158.field_2._8_8_ = puVar7[3];
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    }
    else {
      local_158.field_2._M_allocated_capacity = *puVar10;
      local_158._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_158._M_string_length = puVar7[1];
    *puVar7 = puVar10;
    puVar7[1] = 0;
    *(undefined1 *)puVar10 = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_158);
    paVar9 = &local_f8._M_pathname.field_2;
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 == paVar11) {
      local_f8._M_pathname.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_f8._M_pathname.field_2._8_8_ = plVar6[3];
      local_f8._M_pathname._M_dataplus._M_p = (pointer)paVar9;
    }
    else {
      local_f8._M_pathname.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_f8._M_pathname._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_f8._M_pathname._M_string_length = plVar6[1];
    *plVar6 = (long)paVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)local_70,(string *)&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_pathname._M_dataplus._M_p != paVar9) {
      operator_delete(local_f8._M_pathname._M_dataplus._M_p,
                      local_f8._M_pathname.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dir._M_ptr != &local_128) {
      operator_delete(local_138._M_dir._M_ptr,local_128._M_allocated_capacity + 1);
    }
    uVar13 = local_108._M_allocated_capacity;
    _Var14._M_p = (pointer)local_118._M_dir._M_ptr;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dir._M_ptr == &local_108) goto LAB_0010fa64;
  }
  else {
    std::operator+(&local_60,"Error looking up \'",filename);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_60);
    local_138._M_dir._M_ptr = (element_type *)&local_128;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 == paVar9) {
      local_128._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_128._8_4_ = (undefined4)plVar6[3];
      local_128._12_4_ = *(undefined4 *)((long)plVar6 + 0x1c);
    }
    else {
      local_128._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_138._M_dir._M_ptr = (element_type *)*plVar6;
    }
    local_138._M_dir._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar6[1];
    *plVar6 = (long)paVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    pcVar1 = (path->_M_pathname)._M_dataplus._M_p;
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_90,pcVar1,pcVar1 + (path->_M_pathname)._M_string_length);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_138);
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 == paVar9) {
      local_108._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_108._8_8_ = plVar6[3];
      local_118._M_dir._M_ptr = (element_type *)&local_108;
    }
    else {
      local_108._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_118._M_dir._M_ptr = (element_type *)*plVar6;
    }
    local_118._M_dir._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar6[1];
    *plVar6 = (long)paVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_118);
    paVar9 = &local_158.field_2;
    puVar10 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar10) {
      local_158.field_2._M_allocated_capacity = *puVar10;
      local_158.field_2._8_8_ = puVar7[3];
      local_158._M_dataplus._M_p = (pointer)paVar9;
    }
    else {
      local_158.field_2._M_allocated_capacity = *puVar10;
      local_158._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_158._M_string_length = puVar7[1];
    *puVar7 = puVar10;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    (**(code **)(*(long *)local_a0._M_cat + 0x20))(&local_c0,local_a0._M_cat,local_a0._M_value);
    uVar13 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar9) {
      uVar13 = local_158.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar13 < local_b8 + local_158._M_string_length) {
      uVar12 = 0xf;
      if (local_c0 != local_b0) {
        uVar12 = local_b0[0];
      }
      if (uVar12 < local_b8 + local_158._M_string_length) goto LAB_0010f538;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_c0,0,(char *)0x0,(ulong)local_158._M_dataplus._M_p);
    }
    else {
LAB_0010f538:
      puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_c0);
    }
    local_f8._M_pathname._M_dataplus._M_p = (pointer)&local_f8._M_pathname.field_2;
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 == paVar11) {
      local_f8._M_pathname.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_f8._M_pathname.field_2._8_8_ = puVar7[3];
    }
    else {
      local_f8._M_pathname.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_f8._M_pathname._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_f8._M_pathname._M_string_length = puVar7[1];
    *puVar7 = paVar11;
    puVar7[1] = 0;
    paVar11->_M_local_buf[0] = '\0';
    std::__cxx11::string::operator=((string *)error_msg,(string *)&local_f8);
    paVar11 = &local_f8._M_pathname.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_pathname._M_dataplus._M_p != paVar11) {
      operator_delete(local_f8._M_pathname._M_dataplus._M_p,
                      local_f8._M_pathname.field_2._M_allocated_capacity + 1);
    }
    if (local_c0 != local_b0) {
      operator_delete(local_c0,local_b0[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar9) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dir._M_ptr != &local_108) {
      operator_delete(local_118._M_dir._M_ptr,local_108._M_allocated_capacity + 1);
    }
    if (local_90[0] != local_80) {
      operator_delete(local_90[0],local_80[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dir._M_ptr != &local_128) {
      operator_delete(local_138._M_dir._M_ptr,local_128._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    pcVar1 = (filename->_M_dataplus)._M_p;
    pcVar2 = (path->_M_pathname)._M_dataplus._M_p;
    local_f8._M_pathname._M_dataplus._M_p = (pointer)paVar11;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,pcVar2,pcVar2 + (path->_M_pathname)._M_string_length);
    iVar4 = local_a0._M_value;
    _Var14._M_p = local_f8._M_pathname._M_dataplus._M_p;
    (**(code **)(*(long *)local_a0._M_cat + 0x20))(&local_158,local_a0._M_cat,local_a0._M_value);
    SDL_LogError(1,"Error looking up \'%s\' in \'%s\': %d - %s",pcVar1,_Var14._M_p,iVar4,
                 local_158._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar9) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    uVar13 = local_f8._M_pathname.field_2._M_allocated_capacity;
    _Var14._M_p = local_f8._M_pathname._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_pathname._M_dataplus._M_p == paVar11) goto LAB_0010fa64;
  }
  operator_delete(_Var14._M_p,uVar13 + 1);
LAB_0010fa64:
  std::filesystem::__cxx11::path::path(local_d0);
LAB_0010fa71:
  if (local_40._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40._M_dir._M_refcount._M_pi)
    ;
  }
  return local_d0;
}

Assistant:

filesystem::path lookup_file_insensitive(const filesystem::path &path, const std::string &filename, std::string &error_msg) {
	std::error_code ec;
	filesystem::directory_iterator di{path, ec};

	if (ec) {
		error_msg = "Error looking up '" + filename + "' in '" + path.string().c_str() + "': " + ec.message();
		SDL_LogError(SDL_LOG_CATEGORY_ERROR, "Error looking up '%s' in '%s': %d - %s", filename.c_str(), path.string().c_str(), ec.value(), ec.message().c_str());
		return {};
	}

	for(auto& p: filesystem::directory_iterator(path)) {
		if (compare_string_insensitive(p.path().filename().string(), filename)) {
			return p.path();
		}
	}
	error_msg = filename + ": file not found in '" + path.string() + "'.";
	return {};
}